

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_encoder.h
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerTraversalValenceEncoder::MeshEdgebreakerTraversalValenceEncoder
          (MeshEdgebreakerTraversalValenceEncoder *this)

{
  long in_RDI;
  MeshEdgebreakerTraversalEncoder *in_stack_fffffffffffffff0;
  
  MeshEdgebreakerTraversalEncoder::MeshEdgebreakerTraversalEncoder(in_stack_fffffffffffffff0);
  *(undefined8 *)(in_RDI + 0x98) = 0;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
  ::IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                     *)0x19e667);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
  IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                   *)0x19e679);
  *(undefined4 *)(in_RDI + 0xd0) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xd4) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xd8) = 0;
  *(undefined4 *)(in_RDI + 0xdc) = 2;
  *(undefined4 *)(in_RDI + 0xe0) = 7;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)0x19e6bf);
  return;
}

Assistant:

MeshEdgebreakerTraversalValenceEncoder()
      : corner_table_(nullptr),
        prev_symbol_(-1),
        last_corner_(kInvalidCornerIndex),
        num_symbols_(0),
        min_valence_(2),
        max_valence_(7) {}